

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# workspace_pool.cc
# Opt level: O3

void __thiscall tvm::runtime::WorkspacePool::~WorkspacePool(WorkspacePool *this)

{
  Pool *pPVar1;
  void *pvVar2;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  pointer ppPVar3;
  pointer ppPVar4;
  ulong uVar5;
  long lVar6;
  
  ppPVar4 = (this->array_).
            super__Vector_base<tvm::runtime::WorkspacePool::Pool_*,_std::allocator<tvm::runtime::WorkspacePool::Pool_*>_>
            ._M_impl.super__Vector_impl_data._M_start;
  ppPVar3 = (this->array_).
            super__Vector_base<tvm::runtime::WorkspacePool::Pool_*,_std::allocator<tvm::runtime::WorkspacePool::Pool_*>_>
            ._M_impl.super__Vector_impl_data._M_finish;
  if (ppPVar3 != ppPVar4) {
    lVar6 = 0;
    uVar5 = 0;
    do {
      if (ppPVar4[uVar5] != (Pool *)0x0) {
        Pool::Release(ppPVar4[uVar5],(TVMContext)((ulong)this->device_type_ + lVar6),
                      (this->device_).
                      super___shared_ptr<tvm::runtime::DeviceAPI,_(__gnu_cxx::_Lock_policy)2>._M_ptr
                     );
        pPVar1 = (this->array_).
                 super__Vector_base<tvm::runtime::WorkspacePool::Pool_*,_std::allocator<tvm::runtime::WorkspacePool::Pool_*>_>
                 ._M_impl.super__Vector_impl_data._M_start[uVar5];
        if (pPVar1 != (Pool *)0x0) {
          pvVar2 = *(void **)&(pPVar1->allocated_).
                              super__Vector_base<tvm::runtime::WorkspacePool::Pool::Entry,_std::allocator<tvm::runtime::WorkspacePool::Pool::Entry>_>
                              ._M_impl;
          if (pvVar2 != (void *)0x0) {
            operator_delete(pvVar2,(long)*(pointer *)
                                          ((long)&(pPVar1->allocated_).
                                                  super__Vector_base<tvm::runtime::WorkspacePool::Pool::Entry,_std::allocator<tvm::runtime::WorkspacePool::Pool::Entry>_>
                                          + 0x10) - (long)pvVar2);
          }
          pvVar2 = *(void **)&(pPVar1->free_list_).
                              super__Vector_base<tvm::runtime::WorkspacePool::Pool::Entry,_std::allocator<tvm::runtime::WorkspacePool::Pool::Entry>_>
          ;
          if (pvVar2 != (void *)0x0) {
            operator_delete(pvVar2,(long)*(pointer *)
                                          ((long)&(pPVar1->free_list_).
                                                  super__Vector_base<tvm::runtime::WorkspacePool::Pool::Entry,_std::allocator<tvm::runtime::WorkspacePool::Pool::Entry>_>
                                          + 0x10) - (long)pvVar2);
          }
        }
        operator_delete(pPVar1,0x30);
        ppPVar4 = (this->array_).
                  super__Vector_base<tvm::runtime::WorkspacePool::Pool_*,_std::allocator<tvm::runtime::WorkspacePool::Pool_*>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        ppPVar3 = (this->array_).
                  super__Vector_base<tvm::runtime::WorkspacePool::Pool_*,_std::allocator<tvm::runtime::WorkspacePool::Pool_*>_>
                  ._M_impl.super__Vector_impl_data._M_finish;
      }
      uVar5 = uVar5 + 1;
      lVar6 = lVar6 + 0x100000000;
    } while (uVar5 < (ulong)((long)ppPVar3 - (long)ppPVar4 >> 3));
  }
  this_00 = (this->device_).super___shared_ptr<tvm::runtime::DeviceAPI,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi;
  if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
    ppPVar4 = (this->array_).
              super__Vector_base<tvm::runtime::WorkspacePool::Pool_*,_std::allocator<tvm::runtime::WorkspacePool::Pool_*>_>
              ._M_impl.super__Vector_impl_data._M_start;
  }
  if (ppPVar4 != (pointer)0x0) {
    operator_delete(ppPVar4,(long)(this->array_).
                                  super__Vector_base<tvm::runtime::WorkspacePool::Pool_*,_std::allocator<tvm::runtime::WorkspacePool::Pool_*>_>
                                  ._M_impl.super__Vector_impl_data._M_end_of_storage - (long)ppPVar4
                   );
    return;
  }
  return;
}

Assistant:

WorkspacePool::~WorkspacePool() {
  for (size_t i = 0; i < array_.size(); ++i) {
    if (array_[i] != nullptr) {
      TVMContext ctx;
      ctx.device_type = device_type_;
      ctx.device_id = static_cast<int>(i);
      array_[i]->Release(ctx, device_.get());
      delete array_[i];
    }
  }
}